

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::ensurePolished(QWidget *this)

{
  bool bVar1;
  QWidgetPrivate *this_00;
  QMetaObject *pQVar2;
  QObject *o_00;
  qsizetype qVar3;
  QWidget *pQVar4;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  QObject *o;
  int i;
  QMetaObject *m;
  QWidgetPrivate *d;
  QChildEvent e_1;
  QList<QObject_*> children;
  QEvent e;
  QList<QObject_*> *in_stack_ffffffffffffff78;
  int local_64;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  QList<QObject_*> local_30;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QWidget *)0x368040);
  pQVar2 = (QMetaObject *)(*(code *)**(undefined8 **)in_RDI)();
  if (pQVar2 != this_00->polished) {
    this_00->polished = pQVar2;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_18,Polish);
    QCoreApplication::sendEvent(in_RDI,(QEvent *)&local_18);
    local_30.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_30.d.ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_30.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QObject_*>::QList((QList<QObject_*> *)in_RDI,in_stack_ffffffffffffff78);
    local_64 = 0;
    while( true ) {
      o_00 = (QObject *)(long)local_64;
      qVar3 = QList<QObject_*>::size(&local_30);
      if (qVar3 <= (long)o_00) break;
      QList<QObject_*>::at((QList<QObject_*> *)in_RDI,(qsizetype)o_00);
      bVar1 = QObject::isWidgetType((QObject *)0x368132);
      if ((bVar1) && (pQVar4 = qobject_cast<QWidget*>(o_00), pQVar4 != (QWidget *)0x0)) {
        ensurePolished((QWidget *)this_00);
      }
      local_64 = local_64 + 1;
    }
    if ((*(long *)&this_00->field_0x10 != 0) && ((*(uint *)&this_00->field_0x30 >> 4 & 1) != 0)) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      QChildEvent::QChildEvent((QChildEvent *)&local_48,ChildPolished,in_RDI);
      QCoreApplication::sendEvent(*(QObject **)&this_00->field_0x10,(QEvent *)&local_48);
      QChildEvent::~QChildEvent((QChildEvent *)&local_48);
    }
    QList<QObject_*>::~QList((QList<QObject_*> *)0x3681e6);
    QEvent::~QEvent((QEvent *)&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::ensurePolished() const
{
    Q_D(const QWidget);

    const QMetaObject *m = metaObject();
    if (m == d->polished)
        return;
    d->polished = m;

    QEvent e(QEvent::Polish);
    QCoreApplication::sendEvent(const_cast<QWidget *>(this), &e);

    // polish children after 'this'
    QList<QObject*> children = d->children;
    for (int i = 0; i < children.size(); ++i) {
        QObject *o = children.at(i);
        if (!o->isWidgetType())
            continue;
        if (QWidget *w = qobject_cast<QWidget *>(o))
            w->ensurePolished();
    }

    if (d->parent && d->sendChildEvents) {
        QChildEvent e(QEvent::ChildPolished, const_cast<QWidget *>(this));
        QCoreApplication::sendEvent(d->parent, &e);
    }
}